

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

define_own_property_result
mjs::anon_unknown_33::define_own_property
          (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *p,object_ptr *desc)

{
  uint32_t *puVar1;
  anon_unknown_33 *paVar2;
  object_ptr *poVar3;
  bool bVar4;
  bool bVar5;
  value_type vVar6;
  object *poVar7;
  native_error_exception *this;
  global_object *this_00;
  object *poVar8;
  wchar_t *pwVar9;
  wstring_view p_00;
  wstring_view p_01;
  wstring_view p_02;
  wstring_view p_03;
  wstring_view p_04;
  wstring_view p_05;
  wstring_view p_06;
  wstring_view p_07;
  wstring_view p_08;
  wstring_view name;
  bool local_792;
  bool local_74a;
  bool local_6c3;
  bool local_699;
  bool local_661;
  bool local_5b1;
  bool local_5a1;
  wstring_view local_590;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_580;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_570;
  value local_560;
  byte local_531;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_530;
  value local_520;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_4f8;
  value local_4e8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_4c0;
  int local_4b0;
  byte local_4a9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_4a8;
  value local_498;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_470;
  value local_460;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_438;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_428;
  wstring_view local_418;
  undefined1 local_408 [8];
  object_ptr temp;
  undefined1 local_3e8 [8];
  value s;
  undefined1 local_3b0 [8];
  value g;
  anon_class_24_3_a4a98722 apply_flag;
  property_attribute a;
  value local_358;
  byte local_329;
  wstring_view local_328;
  value local_318;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2f0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2e0;
  byte local_2c9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2c8;
  value local_2b8;
  byte local_289;
  wstring_view local_288;
  value local_278;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_250;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_240;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_230;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_220;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_210;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_200;
  value local_1f0;
  value local_1c8;
  undefined1 local_1a0 [8];
  anon_class_16_2_d5e5c5aa check_accessor;
  undefined1 local_180 [8];
  value set;
  undefined1 local_148 [8];
  value get;
  value local_110;
  undefined1 local_e1;
  basic_string_view<char,_std::char_traits<char>_> local_e0 [2];
  wstring local_c0;
  wstring_view local_a0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_90;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_80;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_70;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_60;
  property_attribute local_4c;
  undefined1 auStack_48 [4];
  property_attribute new_attributes;
  property_attribute local_34;
  anon_unknown_33 *paStack_30;
  property_attribute current_attributes;
  object_ptr *desc_local;
  string *p_local;
  object_ptr *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  paStack_30 = (anon_unknown_33 *)desc;
  desc_local = (object_ptr *)p;
  p_local = (string *)o;
  o_local = (object_ptr *)global;
  poVar7 = gc_heap_ptr<mjs::object>::operator->(o);
  _auStack_48 = string::view((string *)desc_local);
  local_34 = object::own_property_attributes(poVar7,(wstring_view *)auStack_48);
  local_4c = attributes_from_descriptor((object_ptr *)paStack_30);
  poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view(&local_60,L"get");
  bVar4 = object::has_property(poVar7,&local_60);
  if (bVar4) {
LAB_001a73c3:
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_80,L"value");
    bVar4 = object::has_property(poVar7,&local_80);
    desc = (object_ptr *)CONCAT71((int7)((ulong)desc >> 8),bVar4);
    local_5b1 = true;
    if (!bVar4) {
      poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_90,L"writable");
      local_5b1 = object::has_property(poVar7,&local_90);
    }
    local_5a1 = local_5b1;
  }
  else {
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view(&local_70,L"set")
    ;
    bVar4 = object::has_property(poVar7,&local_70);
    desc = (object_ptr *)CONCAT71((int7)((ulong)desc >> 8),bVar4);
    local_5a1 = false;
    if (bVar4) goto LAB_001a73c3;
  }
  if (local_5a1 != false) {
    local_e1 = 1;
    this = (native_error_exception *)__cxa_allocate_exception(0x58);
    this_00 = gc_heap_ptr<mjs::global_object>::operator->
                        ((gc_heap_ptr<mjs::global_object> *)o_local);
    global_object::stack_trace_abi_cxx11_(&local_c0,this_00);
    local_a0 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_c0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_e0,"Accessor property descriptor may not have value or writable attributes");
    native_error_exception::native_error_exception(this,type,&local_a0,local_e0);
    local_e1 = 0;
    __cxa_throw(this,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  bVar4 = is_valid(local_34);
  paVar2 = paStack_30;
  if (!bVar4) {
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
    bVar4 = object::is_extensible(poVar7);
    if (!bVar4) {
      return not_extensible;
    }
    bVar4 = is_generic_descriptor((object_ptr *)paStack_30);
    if ((!bVar4) && (bVar4 = is_data_descriptor((object_ptr *)paStack_30), !bVar4)) {
      poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
      puVar1 = &set.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_;
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)puVar1,L"get");
      (**poVar7->_vptr_object)(local_148,poVar7,puVar1);
      poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&check_accessor.global,
                 L"set");
      (**poVar7->_vptr_object)(local_180,poVar7,&check_accessor.global);
      vVar6 = value::type((value *)local_148);
      bVar4 = true;
      if (vVar6 == undefined) {
        vVar6 = value::type((value *)local_180);
        bVar4 = vVar6 != undefined;
      }
      if (bVar4) {
        local_1a0 = (undefined1  [8])desc_local;
        check_accessor.p = (string *)o_local;
        value::value(&local_1c8,(value *)local_148);
        define_own_property::anon_class_16_2_d5e5c5aa::operator()
                  ((anon_class_16_2_d5e5c5aa *)local_1a0,"Getter",&local_1c8);
        value::~value(&local_1c8);
        value::value(&local_1f0,(value *)local_180);
        define_own_property::anon_class_16_2_d5e5c5aa::operator()
                  ((anon_class_16_2_d5e5c5aa *)local_1a0,"Setter",&local_1f0);
        value::~value(&local_1f0);
        define_accessor_property
                  ((gc_heap_ptr<mjs::global_object> *)o_local,(object_ptr *)p_local,
                   (string *)desc_local,(value *)local_148,(value *)local_180,local_4c);
        global_local._4_4_ = ok;
        value::~value((value *)local_180);
        value::~value((value *)local_148);
        return global_local._4_4_;
      }
      __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                    ,0x6e,
                    "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                   );
    }
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
    poVar3 = desc_local;
    poVar8 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
    puVar1 = &get.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)puVar1,L"value");
    (**poVar8->_vptr_object)(&local_110,poVar8,puVar1);
    (*poVar7->_vptr_object[1])(poVar7,poVar3,&local_110,(ulong)local_4c);
    value::~value(&local_110);
    return ok;
  }
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_200,L"writable");
  p_00._M_str = (wchar_t *)desc;
  p_00._M_len = (size_t)local_200._M_str;
  bVar4 = has_own_property(paVar2,(object_ptr *)local_200._M_len,p_00);
  paVar2 = paStack_30;
  if (!bVar4) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_210,L"enumerable");
    p_01._M_str = (wchar_t *)desc;
    p_01._M_len = (size_t)local_210._M_str;
    bVar4 = has_own_property(paVar2,(object_ptr *)local_210._M_len,p_01);
    paVar2 = paStack_30;
    if (!bVar4) {
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_220,L"configurable");
      p_02._M_str = (wchar_t *)desc;
      p_02._M_len = (size_t)local_220._M_str;
      bVar4 = has_own_property(paVar2,(object_ptr *)local_220._M_len,p_02);
      paVar2 = paStack_30;
      if (!bVar4) {
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_230,L"value");
        p_03._M_str = (wchar_t *)desc;
        p_03._M_len = (size_t)local_230._M_str;
        bVar4 = has_own_property(paVar2,(object_ptr *)local_230._M_len,p_03);
        paVar2 = paStack_30;
        if (!bVar4) {
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_240,L"get");
          p_04._M_str = (wchar_t *)desc;
          p_04._M_len = (size_t)local_240._M_str;
          bVar4 = has_own_property(paVar2,(object_ptr *)local_240._M_len,p_04);
          paVar2 = paStack_30;
          if (!bVar4) {
            std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                      (&local_250,L"set");
            p_05._M_str = (wchar_t *)desc;
            p_05._M_len = (size_t)local_250._M_str;
            bVar4 = has_own_property(paVar2,(object_ptr *)local_250._M_len,p_05);
            if (!bVar4) {
              return ok;
            }
          }
        }
      }
    }
  }
  pwVar9 = (wchar_t *)(ulong)local_34;
  local_289 = 0;
  local_2c9 = 0;
  local_661 = false;
  if (local_34 == local_4c) {
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
    local_288 = string::view((string *)desc_local);
    (**poVar7->_vptr_object)(&local_278,poVar7,&local_288);
    local_289 = 1;
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_2c8,L"value");
    (**poVar7->_vptr_object)(&local_2b8,poVar7,&local_2c8);
    local_2c9 = 1;
    local_661 = mjs::operator==(&local_278,&local_2b8);
  }
  if ((local_2c9 & 1) != 0) {
    value::~value(&local_2b8);
  }
  if ((local_289 & 1) != 0) {
    value::~value(&local_278);
  }
  if (local_661 != false) {
    return ok;
  }
  bVar4 = has_attributes(local_34,dont_delete);
  if (bVar4) {
    bVar4 = has_attributes(local_4c,dont_delete);
    paVar2 = paStack_30;
    if (!bVar4) {
      return cannot_redefine;
    }
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_2e0,L"enumerable");
    p_06._M_str = pwVar9;
    p_06._M_len = (size_t)local_2e0._M_str;
    bVar4 = has_own_property(paVar2,(object_ptr *)local_2e0._M_len,p_06);
    if (bVar4) {
      bVar4 = has_attributes(local_34,dont_enum);
      bVar5 = has_attributes(local_4c,dont_enum);
      pwVar9 = (wchar_t *)(ulong)bVar5;
      if (bVar4 != bVar5) {
        return cannot_redefine;
      }
    }
  }
  bVar4 = is_generic_descriptor((object_ptr *)paStack_30);
  if (!bVar4) {
    bVar4 = has_attributes(local_34,accessor);
    bVar5 = is_data_descriptor((object_ptr *)paStack_30);
    pwVar9 = (wchar_t *)(ulong)bVar5;
    if ((bool)((bVar4 ^ 0xffU) & 1) == bVar5) {
      bVar4 = has_attributes(local_34,accessor);
      if (bVar4) {
        bVar4 = has_attributes(local_34,accessor);
        pwVar9 = (wchar_t *)CONCAT71((int7)((ulong)pwVar9 >> 8),bVar4);
        local_6c3 = false;
        if (bVar4) {
          local_6c3 = is_accessor_descriptor((object_ptr *)paStack_30);
        }
        if (local_6c3 == false) {
          __assert_fail("has_attributes(current_attributes, property_attribute::accessor) && is_accessor_descriptor(desc)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                        ,0xae,
                        "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                       );
        }
      }
      else {
        bVar4 = has_attributes(local_34,dont_delete);
        if ((bVar4) && (bVar4 = has_attributes(local_34,read_only), bVar4)) {
          bVar4 = has_attributes(local_4c,read_only);
          paVar2 = paStack_30;
          if (!bVar4) {
            return cannot_redefine;
          }
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_2f0,L"value");
          p_07._M_str = pwVar9;
          p_07._M_len = (size_t)local_2f0._M_str;
          bVar4 = has_own_property(paVar2,(object_ptr *)local_2f0._M_len,p_07);
          pwVar9 = (wchar_t *)CONCAT71((int7)((ulong)pwVar9 >> 8),bVar4);
          local_329 = 0;
          apply_flag.current_attributes._7_1_ = 0;
          local_699 = false;
          if (bVar4) {
            poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
            local_328 = string::view((string *)desc_local);
            (**poVar7->_vptr_object)(&local_318,poVar7,&local_328);
            local_329 = 1;
            poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
            std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&a,L"value");
            (**poVar7->_vptr_object)
                      (&local_358,poVar7,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&a);
            apply_flag.current_attributes._7_1_ = 1;
            local_699 = mjs::operator!=(&local_318,&local_358);
          }
          if ((apply_flag.current_attributes._7_1_ & 1) != 0) {
            value::~value(&local_358);
          }
          if ((local_329 & 1) != 0) {
            value::~value(&local_318);
          }
          if (local_699 != false) {
            return cannot_redefine;
          }
        }
      }
    }
    else {
      bVar4 = has_attributes(local_34,dont_delete);
      if (bVar4) {
        return cannot_redefine;
      }
    }
  }
  apply_flag.current_attributes._0_4_ = none;
  g.field_1._24_8_ = paStack_30;
  apply_flag.desc = (object_ptr *)&apply_flag.current_attributes;
  apply_flag.a = &local_34;
  define_own_property::anon_class_24_3_a4a98722::operator()
            ((anon_class_24_3_a4a98722 *)
             &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,L"enumerable",dont_enum);
  define_own_property::anon_class_24_3_a4a98722::operator()
            ((anon_class_24_3_a4a98722 *)
             &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,L"configurable",dont_delete);
  bVar4 = is_accessor_descriptor((object_ptr *)paStack_30);
  if ((!bVar4) &&
     ((bVar4 = is_generic_descriptor((object_ptr *)paStack_30), !bVar4 ||
      (bVar4 = has_attributes(local_34,accessor), !bVar4)))) {
    define_own_property::anon_class_24_3_a4a98722::operator()
              ((anon_class_24_3_a4a98722 *)
               &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_,L"writable",read_only);
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
    poVar3 = desc_local;
    paVar2 = paStack_30;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_570,L"value");
    p_08._M_str = pwVar9;
    p_08._M_len = (size_t)local_570._M_str;
    bVar4 = has_own_property(paVar2,(object_ptr *)local_570._M_len,p_08);
    if (bVar4) {
      poVar8 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_580,L"value");
      (**poVar8->_vptr_object)(&local_560,poVar8,&local_580);
    }
    else {
      poVar8 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
      local_590 = string::view((string *)desc_local);
      (**poVar8->_vptr_object)(&local_560,poVar8,&local_590);
    }
    bVar4 = object::redefine_own_property
                      (poVar7,(string *)poVar3,&local_560,
                       (property_attribute)apply_flag.current_attributes);
    value::~value(&local_560);
    if (!bVar4) {
      return cannot_redefine;
    }
    return ok;
  }
  poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
  puVar1 = &s.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
            pos_;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)puVar1,L"get");
  (**poVar7->_vptr_object)(local_3b0,poVar7,puVar1);
  poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
  puVar1 = &temp.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)puVar1,L"set");
  (**poVar7->_vptr_object)(local_3e8,poVar7,puVar1);
  bVar4 = has_attributes(local_34,accessor);
  if (bVar4) {
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)p_local);
    local_418 = string::view((string *)desc_local);
    name._M_str = (wchar_t *)local_418._M_len;
    name._M_len = (size_t)poVar7;
    object::get_accessor_property_object((object *)local_408,name);
    poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)paStack_30);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_428,L"get");
    bVar4 = object::has_property(poVar7,&local_428);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      local_4a9 = 0;
      bVar4 = has_attributes(local_34,read_only);
      local_74a = false;
      if (bVar4) {
        poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_4a8,L"get");
        (**poVar7->_vptr_object)(&local_498,poVar7,&local_4a8);
        local_4a9 = 1;
        local_74a = mjs::operator!=((value *)local_3b0,&local_498);
      }
      if ((local_4a9 & 1) != 0) {
        value::~value(&local_498);
      }
      if (local_74a == false) goto LAB_001a8400;
      global_local._4_4_ = cannot_redefine;
      local_4b0 = 1;
    }
    else {
      poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_438,L"get");
      bVar4 = object::has_property(poVar7,&local_438);
      if (bVar4) {
        poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_470,L"get");
        (**poVar7->_vptr_object)(&local_460,poVar7,&local_470);
        value::operator=((value *)local_3b0,&local_460);
        value::~value(&local_460);
      }
LAB_001a8400:
      vVar6 = value::type((value *)local_3e8);
      if (vVar6 == undefined) {
        poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_4c0,L"set");
        bVar4 = object::has_property(poVar7,&local_4c0);
        if (bVar4) {
          poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_4f8,L"set");
          (**poVar7->_vptr_object)(&local_4e8,poVar7,&local_4f8);
          value::operator=((value *)local_3e8,&local_4e8);
          value::~value(&local_4e8);
        }
      }
      else {
        local_531 = 0;
        bVar4 = has_attributes(local_34,read_only);
        local_792 = false;
        if (bVar4) {
          poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_408);
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_530,L"set");
          (**poVar7->_vptr_object)(&local_520,poVar7,&local_530);
          local_531 = 1;
          local_792 = mjs::operator!=((value *)local_3e8,&local_520);
        }
        if ((local_531 & 1) != 0) {
          value::~value(&local_520);
        }
        if (local_792 != false) {
          global_local._4_4_ = cannot_redefine;
          local_4b0 = 1;
          goto LAB_001a862f;
        }
      }
      local_4b0 = 0;
    }
LAB_001a862f:
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_408);
    if (local_4b0 != 0) goto LAB_001a8690;
  }
  define_accessor_property
            ((gc_heap_ptr<mjs::global_object> *)o_local,(object_ptr *)p_local,(string *)desc_local,
             (value *)local_3b0,(value *)local_3e8,(property_attribute)apply_flag.current_attributes
            );
  global_local._4_4_ = ok;
  local_4b0 = 1;
LAB_001a8690:
  value::~value((value *)local_3e8);
  value::~value((value *)local_3b0);
  return global_local._4_4_;
}

Assistant:

define_own_property_result define_own_property(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& p, const object_ptr& desc) {
    const auto current_attributes = o->own_property_attributes(p.view());
    const auto new_attributes = attributes_from_descriptor(desc);

    if ((desc->has_property(L"get") || desc->has_property(L"set")) && (desc->has_property(L"value") || desc->has_property(L"writable"))) {
        throw native_error_exception{native_error_type::type, global->stack_trace(), "Accessor property descriptor may not have value or writable attributes"};
    }

    if (!is_valid(current_attributes)) {
        if (!o->is_extensible()) {
            return define_own_property_result::not_extensible;
        }

        // property not already present
        if (is_generic_descriptor(desc) || is_data_descriptor(desc)) {
            o->put(p, desc->get(L"value"), new_attributes);
            return define_own_property_result::ok;
        } else {
            auto get = desc->get(L"get");
            auto set = desc->get(L"set");
            assert(get.type() != value_type::undefined || set.type() != value_type::undefined); // Should be handle above

            auto check_accessor = [&](const char* name, const value v) {
                if (v.type() != value_type::undefined && !is_function(v)) {
                    std::wostringstream woss;
                    woss << name << " for \"" << cpp_quote(p.view()) << "\" must be a function: " << to_string(global.heap(), v);
                    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
                }
            };
            check_accessor("Getter", get);
            check_accessor("Setter", set);
            define_accessor_property(global, o, p, get, set, new_attributes);
            return define_own_property_result::ok;
        }
    }

    // If descriptor is empty or all fields are equal
    if (!has_own_property(desc, L"writable")
        && !has_own_property(desc, L"enumerable")
        && !has_own_property(desc, L"configurable")
        && !has_own_property(desc, L"value")
        && !has_own_property(desc, L"get")
        && !has_own_property(desc, L"set")) {
        return define_own_property_result::ok;
    } else if (current_attributes == new_attributes && o->get(p.view()) == desc->get(L"value")) {
        return define_own_property_result::ok;
    }

    if (has_attributes(current_attributes, property_attribute::dont_delete)) {
        // 7. If the [[Configurable]] field of current is false then

        if (!has_attributes(new_attributes, property_attribute::dont_delete)) {
            // Reject, if the [[Configurable]] field of Desc is true.
            return define_own_property_result::cannot_redefine;
        }
        if (has_own_property(desc, L"enumerable") && has_attributes(current_attributes, property_attribute::dont_enum) != has_attributes(new_attributes, property_attribute::dont_enum)) {
            // Reject, if the [[Enumerable]] field of Desc is present and the [[Enumerable]] fields of current and Desc are the Boolean negation of each other.
            return define_own_property_result::cannot_redefine;
        }
    }

    if (is_generic_descriptor(desc)) {
        // 8. If IsGenericDescriptor(Desc) is true, then no further validation is required.
    } else if (!has_attributes(current_attributes, property_attribute::accessor) != is_data_descriptor(desc)) {
        // 9 Else, if IsDataDescriptor(current) and IsDataDescriptor(Desc) have different results, then 
        if (has_attributes(current_attributes, property_attribute::dont_delete)) {
            // 9.a Reject, if the [[Configurable]] field of current is false.
            return define_own_property_result::cannot_redefine;
        }
    } else if (!has_attributes(current_attributes, property_attribute::accessor)) {
        if (has_attributes(current_attributes, property_attribute::dont_delete)) {
            // 10.a
            if (has_attributes(current_attributes, property_attribute::read_only)) {
                if (!has_attributes(new_attributes, property_attribute::read_only)) {
                    // 10.a.i
                    return define_own_property_result::cannot_redefine;
                }
                if (has_own_property(desc, L"value") && o->get(p.view()) != desc->get(L"value")) {
                    // 10.a.ii
                    return define_own_property_result::cannot_redefine;
                }
            }
        }
    } else {
        assert(has_attributes(current_attributes, property_attribute::accessor) && is_accessor_descriptor(desc));
    }

    property_attribute a = property_attribute::none;
    auto apply_flag = [&](const wchar_t* name, property_attribute f) {
        if (desc->has_property(name)) {
            if (!to_boolean(desc->get(name))) {
                a |= f;
            }
        } else {
            a |= current_attributes & f;
        }
    };

    apply_flag(L"enumerable", property_attribute::dont_enum);
    apply_flag(L"configurable", property_attribute::dont_delete);
    if (is_accessor_descriptor(desc) || (is_generic_descriptor(desc) && has_attributes(current_attributes, property_attribute::accessor))) {
        auto g = desc->get(L"get");
        auto s = desc->get(L"set");
        if (has_attributes(current_attributes, property_attribute::accessor)) {
            auto temp = o->get_accessor_property_object(p.view());
            if (!desc->has_property(L"get")) {
                if (temp->has_property(L"get")) {
                    g = temp->get(L"get");
                }
            } else if (has_attributes(current_attributes, property_attribute::read_only) && g != temp->get(L"get")) {
                return define_own_property_result::cannot_redefine;
            }

            if (s.type() == value_type::undefined) {
                if (temp->has_property(L"set")) {
                    s = temp->get(L"set");
                }
            } else if (has_attributes(current_attributes, property_attribute::read_only) && s != temp->get(L"set")) {
                return define_own_property_result::cannot_redefine;
            }
        }

        define_accessor_property(global, o, p, g, s, a);
        return define_own_property_result::ok;
    } else {
        apply_flag(L"writable", property_attribute::read_only);
        if (o->redefine_own_property(p, has_own_property(desc, L"value") ? desc->get(L"value") : o->get(p.view()), a)) {
            return define_own_property_result::ok;
        } else {
            return define_own_property_result::cannot_redefine;
        }
    }
}